

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O0

int run_test_threadpool_cancel_getaddrinfo(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop_00;
  int r;
  uv_loop_t *loop;
  addrinfo hints;
  cancel_info ci;
  uv_getaddrinfo_t reqs [4];
  
  hints.ai_next = (addrinfo *)&ci.timer_handle.start_id;
  ci.reqs._0_4_ = 4;
  ci.reqs._4_4_ = 0xa0;
  uVar2 = uv_default_loop();
  saturate_threadpool();
  iVar1 = uv_getaddrinfo(uVar2,&ci.timer_handle.start_id,getaddrinfo_cb,"fail",0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xb0,"r == 0");
    abort();
  }
  iVar1 = uv_getaddrinfo(uVar2,&reqs[0].retcode,getaddrinfo_cb,0,"fail");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xb3,"r == 0");
    abort();
  }
  iVar1 = uv_getaddrinfo(uVar2,&reqs[1].retcode,getaddrinfo_cb,"fail","fail",0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xb6,"r == 0");
    abort();
  }
  iVar1 = uv_getaddrinfo(uVar2,&reqs[2].retcode,getaddrinfo_cb,"fail",0,&loop);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xb9,"r == 0");
    abort();
  }
  iVar1 = uv_timer_init(uVar2,&ci.nreqs);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xbb,"0 == uv_timer_init(loop, &ci.timer_handle)");
    abort();
  }
  iVar1 = uv_timer_start(&ci.nreqs,timer_cb,10,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xbc,"0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0)");
    abort();
  }
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xbd,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (timer_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xbe,"1 == timer_cb_called");
    abort();
  }
  loop_00 = (uv_loop_t *)uv_default_loop();
  close_loop(loop_00);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0xc0,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(threadpool_cancel_getaddrinfo) {
  uv_getaddrinfo_t reqs[4];
  struct cancel_info ci;
  struct addrinfo hints;
  uv_loop_t* loop;
  int r;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  r = uv_getaddrinfo(loop, reqs + 0, getaddrinfo_cb, "fail", NULL, NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 1, getaddrinfo_cb, NULL, "fail", NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 2, getaddrinfo_cb, "fail", "fail", NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 3, getaddrinfo_cb, "fail", NULL, &hints);
  ASSERT(r == 0);

  ASSERT(0 == uv_timer_init(loop, &ci.timer_handle));
  ASSERT(0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}